

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_object_isPrototypeOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  uint uVar4;
  JSRefCountHeader *p;
  int64_t iVar5;
  ulong uVar6;
  JSRefCountHeader *p_2;
  JSValue JVar7;
  JSValue obj;
  JSValueUnion JVar3;
  
  iVar5 = 1;
  if ((int)argv->tag == -1) {
    JVar3 = (JSValueUnion)(argv->u).ptr;
    obj.tag = argv->tag;
    obj.u.ptr = JVar3.ptr;
    JVar7 = JS_ToObject(ctx,this_val);
    JVar2 = JVar7.u;
    uVar4 = (uint)JVar7.tag;
    if (uVar4 != 6) {
      *(int *)JVar3.ptr = *JVar3.ptr + 1;
      do {
        do {
          obj = JS_GetPrototypeFree(ctx,obj);
          JVar3 = obj.u;
          uVar6 = obj.tag & 0xffffffff;
          if (uVar6 == 6) goto LAB_0015ff36;
          if ((uVar6 == 2) || (JVar2.ptr == JVar3.ptr)) {
            if ((0xfffffff4 < (uint)obj.tag) &&
               (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
              __JS_FreeValueRT(ctx->rt,obj);
            }
            if ((0xfffffff4 < uVar4) &&
               (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar7);
            }
            JVar3._1_7_ = 0;
            JVar3.int32._0_1_ = uVar6 != 2;
            goto LAB_0015ff88;
          }
          iVar1 = ctx->interrupt_counter;
          ctx->interrupt_counter = iVar1 + -1;
        } while (1 < iVar1);
        iVar1 = __js_poll_interrupts(ctx);
      } while (iVar1 == 0);
LAB_0015ff36:
      if ((0xfffffff4 < (uint)obj.tag) &&
         (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,obj);
      }
      if ((0xfffffff4 < uVar4) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar7);
      }
    }
    JVar3.float64 = 0.0;
    iVar5 = 6;
  }
  else {
    JVar3.float64 = 0.0;
  }
LAB_0015ff88:
  JVar7.tag = iVar5;
  JVar7.u.float64 = JVar3.float64;
  return JVar7;
}

Assistant:

static JSValue js_object_isPrototypeOf(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValue obj, v1;
    JSValueConst v;
    int res;

    v = argv[0];
    if (!JS_IsObject(v))
        return JS_FALSE;
    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    v1 = JS_DupValue(ctx, v);
    for(;;) {
        v1 = JS_GetPrototypeFree(ctx, v1);
        if (JS_IsException(v1))
            goto exception;
        if (JS_IsNull(v1)) {
            res = FALSE;
            break;
        }
        if (JS_VALUE_GET_OBJ(obj) == JS_VALUE_GET_OBJ(v1)) {
            res = TRUE;
            break;
        }
        /* avoid infinite loop (possible with proxies) */
        if (js_poll_interrupts(ctx))
            goto exception;
    }
    JS_FreeValue(ctx, v1);
    JS_FreeValue(ctx, obj);
    return JS_NewBool(ctx, res);

exception:
    JS_FreeValue(ctx, v1);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}